

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

int __thiscall QProcess::open(QProcess *this,char *__file,int __oflag,...)

{
  QProcessPrivate *this_00;
  undefined8 extraout_RAX;
  OpenMode mode;
  
  mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = SUB84(__file,0);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((this_00->program).d.size != 0) {
      QProcessPrivate::start(this_00,mode);
      return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    open((char *)this_00,
         (int)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  }
  else {
    open((char *)this_00,
         (int)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  }
  return 0;
}

Assistant:

bool QProcess::open(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return false;
    }
    if (d->program.isEmpty()) {
        qWarning("QProcess::start: program not set");
        return false;
    }

    d->start(mode);
    return true;
}